

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantities_testing_kernels.h
# Opt level: O2

int Quantities_scalefactor_energy_(int ie,Dimensions dims)

{
  if (ie < dims.ne) {
    return 1 << ((byte)((ulong)(ie * 0x556 + 0x24d69) % 0xae529) & 3);
  }
  __assert_fail("ie >= 0 && ie < dims.ne",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                ,0x3a,"int Quantities_scalefactor_energy_(int, Dimensions)");
}

Assistant:

TARGET_HD static inline int Quantities_scalefactor_energy_( int ie,
                                                            Dimensions dims )
{
  /*---Random power-of-two multiplier for each energy group,
       to help catch errors regarding indexing of energy groups.
  ---*/
  Assert( ie >= 0 && ie < dims.ne );

  const int im = 714025;
  const int ia = 1366;
  const int ic = 150889;

  int result = ( (ie)*ia + ic ) % im;
  result = result & ( (1<<2) - 1 );
  result = 1 << result;

  return result;
}